

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O3

ze_result_t
zeGetCommandListProcAddrTable(ze_api_version_t version,ze_command_list_dditable_t *pDdiTable)

{
  ze_result_t zVar1;
  
  if (pDdiTable != (ze_command_list_dditable_t *)0x0) {
    zVar1 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if ((int)version <= driver::context) {
      pDdiTable->pfnCreate = driver::zeCommandListCreate;
      pDdiTable->pfnCreateImmediate = driver::zeCommandListCreateImmediate;
      pDdiTable->pfnDestroy = driver::zeCommandListDestroy;
      pDdiTable->pfnClose = driver::zeCommandListClose;
      pDdiTable->pfnReset = driver::zeCommandListReset;
      pDdiTable->pfnAppendWriteGlobalTimestamp = driver::zeCommandListAppendWriteGlobalTimestamp;
      pDdiTable->pfnAppendBarrier = driver::zeCommandListAppendBarrier;
      pDdiTable->pfnAppendMemoryRangesBarrier = driver::zeCommandListAppendMemoryRangesBarrier;
      pDdiTable->pfnAppendMemoryCopy = driver::zeCommandListAppendMemoryCopy;
      pDdiTable->pfnAppendMemoryFill = driver::zeCommandListAppendMemoryFill;
      pDdiTable->pfnAppendMemoryCopyRegion = driver::zeCommandListAppendMemoryCopyRegion;
      pDdiTable->pfnAppendMemoryCopyFromContext = driver::zeCommandListAppendMemoryCopyFromContext;
      pDdiTable->pfnAppendImageCopy = driver::zeCommandListAppendImageCopy;
      pDdiTable->pfnAppendImageCopyRegion = driver::zeCommandListAppendImageCopyRegion;
      pDdiTable->pfnAppendImageCopyToMemory = driver::zeCommandListAppendImageCopyToMemory;
      pDdiTable->pfnAppendImageCopyFromMemory = driver::zeCommandListAppendImageCopyFromMemory;
      pDdiTable->pfnAppendMemoryPrefetch = driver::zeCommandListAppendMemoryPrefetch;
      pDdiTable->pfnAppendMemAdvise = driver::zeCommandListAppendMemAdvise;
      pDdiTable->pfnAppendSignalEvent = driver::zeCommandListAppendSignalEvent;
      pDdiTable->pfnAppendWaitOnEvents = driver::zeCommandListAppendWaitOnEvents;
      pDdiTable->pfnAppendEventReset = driver::zeCommandListAppendEventReset;
      pDdiTable->pfnAppendQueryKernelTimestamps = driver::zeCommandListAppendQueryKernelTimestamps;
      pDdiTable->pfnAppendLaunchKernel = driver::zeCommandListAppendLaunchKernel;
      pDdiTable->pfnAppendLaunchCooperativeKernel =
           driver::zeCommandListAppendLaunchCooperativeKernel;
      pDdiTable->pfnAppendLaunchKernelIndirect = driver::zeCommandListAppendLaunchKernelIndirect;
      pDdiTable->pfnAppendLaunchMultipleKernelsIndirect =
           driver::zeCommandListAppendLaunchMultipleKernelsIndirect;
      pDdiTable->pfnAppendSignalExternalSemaphoreExt =
           driver::zeCommandListAppendSignalExternalSemaphoreExt;
      pDdiTable->pfnAppendWaitExternalSemaphoreExt =
           driver::zeCommandListAppendWaitExternalSemaphoreExt;
      pDdiTable->pfnAppendImageCopyToMemoryExt = driver::zeCommandListAppendImageCopyToMemoryExt;
      pDdiTable->pfnAppendImageCopyFromMemoryExt = driver::zeCommandListAppendImageCopyFromMemoryExt
      ;
      pDdiTable->pfnHostSynchronize = driver::zeCommandListHostSynchronize;
      pDdiTable->pfnGetDeviceHandle = driver::zeCommandListGetDeviceHandle;
      pDdiTable->pfnGetContextHandle = driver::zeCommandListGetContextHandle;
      pDdiTable->pfnGetOrdinal = driver::zeCommandListGetOrdinal;
      pDdiTable->pfnImmediateGetIndex = driver::zeCommandListImmediateGetIndex;
      pDdiTable->pfnIsImmediate = driver::zeCommandListIsImmediate;
      zVar1 = ZE_RESULT_SUCCESS;
    }
    return zVar1;
  }
  return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetCommandListProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_command_list_dditable_t* pDdiTable           ///< [in,out] pointer to table of DDI function pointers
    )
{
    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( driver::context.version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    pDdiTable->pfnCreate                                 = driver::zeCommandListCreate;

    pDdiTable->pfnCreateImmediate                        = driver::zeCommandListCreateImmediate;

    pDdiTable->pfnDestroy                                = driver::zeCommandListDestroy;

    pDdiTable->pfnClose                                  = driver::zeCommandListClose;

    pDdiTable->pfnReset                                  = driver::zeCommandListReset;

    pDdiTable->pfnAppendWriteGlobalTimestamp             = driver::zeCommandListAppendWriteGlobalTimestamp;

    pDdiTable->pfnAppendBarrier                          = driver::zeCommandListAppendBarrier;

    pDdiTable->pfnAppendMemoryRangesBarrier              = driver::zeCommandListAppendMemoryRangesBarrier;

    pDdiTable->pfnAppendMemoryCopy                       = driver::zeCommandListAppendMemoryCopy;

    pDdiTable->pfnAppendMemoryFill                       = driver::zeCommandListAppendMemoryFill;

    pDdiTable->pfnAppendMemoryCopyRegion                 = driver::zeCommandListAppendMemoryCopyRegion;

    pDdiTable->pfnAppendMemoryCopyFromContext            = driver::zeCommandListAppendMemoryCopyFromContext;

    pDdiTable->pfnAppendImageCopy                        = driver::zeCommandListAppendImageCopy;

    pDdiTable->pfnAppendImageCopyRegion                  = driver::zeCommandListAppendImageCopyRegion;

    pDdiTable->pfnAppendImageCopyToMemory                = driver::zeCommandListAppendImageCopyToMemory;

    pDdiTable->pfnAppendImageCopyFromMemory              = driver::zeCommandListAppendImageCopyFromMemory;

    pDdiTable->pfnAppendMemoryPrefetch                   = driver::zeCommandListAppendMemoryPrefetch;

    pDdiTable->pfnAppendMemAdvise                        = driver::zeCommandListAppendMemAdvise;

    pDdiTable->pfnAppendSignalEvent                      = driver::zeCommandListAppendSignalEvent;

    pDdiTable->pfnAppendWaitOnEvents                     = driver::zeCommandListAppendWaitOnEvents;

    pDdiTable->pfnAppendEventReset                       = driver::zeCommandListAppendEventReset;

    pDdiTable->pfnAppendQueryKernelTimestamps            = driver::zeCommandListAppendQueryKernelTimestamps;

    pDdiTable->pfnAppendLaunchKernel                     = driver::zeCommandListAppendLaunchKernel;

    pDdiTable->pfnAppendLaunchCooperativeKernel          = driver::zeCommandListAppendLaunchCooperativeKernel;

    pDdiTable->pfnAppendLaunchKernelIndirect             = driver::zeCommandListAppendLaunchKernelIndirect;

    pDdiTable->pfnAppendLaunchMultipleKernelsIndirect    = driver::zeCommandListAppendLaunchMultipleKernelsIndirect;

    pDdiTable->pfnAppendSignalExternalSemaphoreExt       = driver::zeCommandListAppendSignalExternalSemaphoreExt;

    pDdiTable->pfnAppendWaitExternalSemaphoreExt         = driver::zeCommandListAppendWaitExternalSemaphoreExt;

    pDdiTable->pfnAppendImageCopyToMemoryExt             = driver::zeCommandListAppendImageCopyToMemoryExt;

    pDdiTable->pfnAppendImageCopyFromMemoryExt           = driver::zeCommandListAppendImageCopyFromMemoryExt;

    pDdiTable->pfnHostSynchronize                        = driver::zeCommandListHostSynchronize;

    pDdiTable->pfnGetDeviceHandle                        = driver::zeCommandListGetDeviceHandle;

    pDdiTable->pfnGetContextHandle                       = driver::zeCommandListGetContextHandle;

    pDdiTable->pfnGetOrdinal                             = driver::zeCommandListGetOrdinal;

    pDdiTable->pfnImmediateGetIndex                      = driver::zeCommandListImmediateGetIndex;

    pDdiTable->pfnIsImmediate                            = driver::zeCommandListIsImmediate;

    return result;
}